

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

void AdjustOpenGLLogicalScalingVector(int *x,int *y,float *rx,float *ry)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  SDL_Rect SVar4;
  float local_80;
  float local_74;
  undefined8 local_68;
  SDL_Rect local_60;
  float trunc_y;
  float trunc_x;
  float float_y;
  float float_x;
  float scale_y;
  float scale_x;
  int physical_h;
  int physical_w;
  SDL_Rect viewport;
  float *ry_local;
  float *rx_local;
  int *y_local;
  int *x_local;
  
  if ((OpenGLLogicalScalingFBO != 0) && (VideoWindow20 != (SDL_Window *)0x0)) {
    viewport._8_8_ = ry;
    (*SDL20_GetWindowSize)(VideoWindow20,(int *)&scale_x,(int *)&scale_y);
    SVar4 = GetOpenGLLogicalScalingViewport((int)scale_x,(int)scale_y);
    local_68 = SVar4._0_8_;
    _physical_h = local_68;
    local_60._0_8_ = SVar4._8_8_;
    viewport.x = local_60.x;
    viewport.y = local_60.y;
    uVar1 = viewport._0_8_;
    viewport.x = SVar4.w;
    viewport.y = SVar4.h;
    if (rx == (float *)0x0) {
      local_74 = 0.0;
    }
    else {
      local_74 = *rx;
    }
    local_74 = (float)*x * ((float)OpenGLLogicalScalingWidth / (float)viewport.x) + local_74;
    if (viewport._8_8_ == 0) {
      local_80 = 0.0;
    }
    else {
      local_80 = *(float *)viewport._8_8_;
    }
    local_80 = (float)*y * ((float)OpenGLLogicalScalingHeight / (float)viewport.y) + local_80;
    viewport._0_8_ = uVar1;
    fVar2 = SDL20_truncf(local_74);
    fVar3 = SDL20_truncf(local_80);
    *x = (int)fVar2;
    *y = (int)fVar3;
    if (rx != (float *)0x0) {
      *rx = local_74 - fVar2;
    }
    if (viewport._8_8_ != 0) {
      *(float *)viewport._8_8_ = local_80 - fVar3;
    }
  }
  return;
}

Assistant:

static void
AdjustOpenGLLogicalScalingVector(int *x, int *y, float *rx, float *ry)
{
    SDL_Rect viewport;
    int physical_w, physical_h;
    float scale_x, scale_y;
    float float_x, float_y;
    float trunc_x, trunc_y;

    /* Don't adjust anything if we're not using Logical Scaling */
    if (!OpenGLLogicalScalingFBO || !VideoWindow20) {
        return;
    }

    /* we want to scale based on the window size, which is dpi-scaled */
    SDL20_GetWindowSize(VideoWindow20, &physical_w, &physical_h);
    viewport = GetOpenGLLogicalScalingViewport(physical_w, physical_h);

    scale_x = (float)OpenGLLogicalScalingWidth / viewport.w;
    scale_y = (float)OpenGLLogicalScalingHeight / viewport.h;

    float_x = *x * scale_x + (rx ? *rx : 0.f);
    float_y = *y * scale_y + (ry ? *ry : 0.f);

    trunc_x = SDL20_truncf(float_x);
    trunc_y = SDL20_truncf(float_y);

    *x = (int)trunc_x;
    *y = (int)trunc_y;

    if (rx) {
        *rx = float_x - trunc_x;
    }
    if (ry) {
        *ry = float_y - trunc_y;
    }
}